

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_Limb::RS_Limb
          (RS_Limb *this,string *name,LimbID id,LinkData *data,
          shared_ptr<chrono::ChMaterialSurface> *wheel_mat,
          shared_ptr<chrono::ChMaterialSurface> *link_mat,ChSystem *system)

{
  double newmass;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  *this_00;
  reference pCVar5;
  long lVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
  local_298;
  shared_ptr<chrono::ChPhysicsItem> local_268;
  undefined1 local_258 [8];
  CylinderShape cyl;
  const_iterator __end3;
  const_iterator __begin3;
  vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  *__range3;
  ChFrame<double> local_1d8;
  undefined1 local_150 [8];
  ChVector<double> inertia_xy;
  ChVector<double> inertia_xx;
  ChVector<double> com;
  double mass;
  shared_ptr<chrono::ChMaterialSurface> local_e0 [2];
  shared_ptr<chrono::robosimian::RS_Part> local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  shared_ptr<chrono::ChMaterialSurface> local_80 [2];
  shared_ptr<chrono::robosimian::RS_Part> local_60;
  undefined1 local_50 [8];
  shared_ptr<chrono::robosimian::RS_Part> link;
  bool is_wheel;
  int i;
  shared_ptr<chrono::ChMaterialSurface> *link_mat_local;
  shared_ptr<chrono::ChMaterialSurface> *wheel_mat_local;
  LinkData *data_local;
  LimbID id_local;
  string *name_local;
  RS_Limb *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>_>
  ::unordered_map(&this->m_links);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLink>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLink>_>_>_>
  ::unordered_map(&this->m_joints);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>_>
  ::unordered_map(&this->m_motors);
  std::shared_ptr<chrono::robosimian::RS_Part>::shared_ptr(&this->m_wheel);
  std::shared_ptr<chrono::ChLinkMotorRotation>::shared_ptr(&this->m_wheel_motor);
  this->m_collide_links = false;
  this->m_collide_wheel = true;
  for (link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi._4_4_ = 0;
      link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ < 0xb;
      link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._4_4_ + 1) {
    iVar2 = std::__cxx11::string::compare
                      ((char *)(data + link.
                                       super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi._4_4_));
    link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._3_1_ = iVar2 == 0;
    std::shared_ptr<chrono::robosimian::RS_Part>::shared_ptr
              ((shared_ptr<chrono::robosimian::RS_Part> *)local_50);
    if ((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._3_1_ & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mass,
                     (char *)this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mass);
      chrono_types::
      make_shared<chrono::robosimian::RS_Part,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::ChSystem_*&,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 local_e0,(ChSystem **)link_mat);
      std::shared_ptr<chrono::robosimian::RS_Part>::operator=
                ((shared_ptr<chrono::robosimian::RS_Part> *)local_50,local_c0);
      std::shared_ptr<chrono::robosimian::RS_Part>::~shared_ptr(local_c0);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)&mass);
    }
    else {
      std::operator+(local_a0,(char *)this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     local_a0);
      chrono_types::
      make_shared<chrono::robosimian::RS_Part,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::ChSystem_*&,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                 local_80,(ChSystem **)wheel_mat);
      std::shared_ptr<chrono::robosimian::RS_Part>::operator=
                ((shared_ptr<chrono::robosimian::RS_Part> *)local_50,&local_60);
      std::shared_ptr<chrono::robosimian::RS_Part>::~shared_ptr(&local_60);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)local_a0);
    }
    newmass = data[link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._4_4_].link.m_mass;
    ChVector<double>::ChVector
              ((ChVector<double> *)(inertia_xx.m_data + 2),
               &data[link.
                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_].link.m_com);
    ChVector<double>::ChVector
              ((ChVector<double> *)(inertia_xy.m_data + 2),
               &data[link.
                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_].link.m_inertia_xx);
    ChVector<double>::ChVector
              ((ChVector<double> *)local_150,
               &data[link.
                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_].link.m_inertia_xy);
    peVar3 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    peVar4 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar3->m_body);
    ChObj::SetIdentifier
              ((ChObj *)peVar4,
               link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_ + 4 + id * 4);
    peVar3 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    peVar4 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar3->m_body);
    ChBody::SetMass((ChBody *)peVar4,newmass);
    peVar3 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    peVar4 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar3->m_body);
    ChQuaternion<double>::ChQuaternion((ChQuaternion<double> *)&__range3,1.0,0.0,0.0,0.0);
    ChFrame<double>::ChFrame
              (&local_1d8,(ChVector<double> *)(inertia_xx.m_data + 2),
               (ChQuaternion<double> *)&__range3);
    chrono::ChBodyAuxRef::SetFrame_COG_to_REF((ChFrame *)peVar4);
    ChFrame<double>::~ChFrame(&local_1d8);
    peVar3 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    peVar4 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar3->m_body);
    chrono::ChBody::SetInertiaXX(peVar4);
    peVar3 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    peVar4 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar3->m_body);
    chrono::ChBody::SetInertiaXY(peVar4);
    lVar6 = (long)link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_;
    peVar3 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    std::__cxx11::string::operator=((string *)&peVar3->m_mesh_name,(string *)&data[lVar6].link);
    lVar6 = (long)link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_;
    peVar3 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    ChVector<double>::operator=(&peVar3->m_offset,&data[lVar6].link.m_offset);
    lVar6 = (long)link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_;
    peVar3 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    ChColor::operator=(&peVar3->m_color,&data[lVar6].link.m_color);
    this_00 = &data[link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._4_4_].link.m_shapes;
    __end3 = std::
             vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
             ::begin(this_00);
    cyl.m_length = (double)std::
                           vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
                           ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_chrono::robosimian::CylinderShape_*,_std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>_>
                                  *)&cyl.m_length);
      if (!bVar1) break;
      pCVar5 = __gnu_cxx::
               __normal_iterator<const_chrono::robosimian::CylinderShape_*,_std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>_>
               ::operator*(&__end3);
      CylinderShape::CylinderShape((CylinderShape *)local_258,pCVar5);
      peVar3 = std::
               __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      std::
      vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
      ::push_back(&peVar3->m_cylinders,(value_type *)local_258);
      __gnu_cxx::
      __normal_iterator<const_chrono::robosimian::CylinderShape_*,_std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>_>
      ::operator++(&__end3);
    }
    if ((data[link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_].include & 1U) != 0) {
      peVar3 = std::
               __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChBodyAuxRef,void>
                (&local_268,&peVar3->m_body);
      chrono::ChSystem::Add(system,&local_268);
      std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_268);
    }
    std::make_pair<std::__cxx11::string_const&,std::shared_ptr<chrono::robosimian::RS_Part>&>
              (&local_298,
               &data[link.
                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_].name,
               (shared_ptr<chrono::robosimian::RS_Part> *)local_50);
    std::
    unordered_map<std::__cxx11::string,std::shared_ptr<chrono::robosimian::RS_Part>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>>>
    ::insert<std::pair<std::__cxx11::string,std::shared_ptr<chrono::robosimian::RS_Part>>>
              ((unordered_map<std::__cxx11::string,std::shared_ptr<chrono::robosimian::RS_Part>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>>>
                *)&this->m_links,&local_298);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
    ::~pair(&local_298);
    if ((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._3_1_ & 1) != 0) {
      std::shared_ptr<chrono::robosimian::RS_Part>::operator=
                (&this->m_wheel,(shared_ptr<chrono::robosimian::RS_Part> *)local_50);
    }
    std::shared_ptr<chrono::robosimian::RS_Part>::~shared_ptr
              ((shared_ptr<chrono::robosimian::RS_Part> *)local_50);
  }
  return;
}

Assistant:

RS_Limb::RS_Limb(const std::string& name,
                 LimbID id,
                 const LinkData data[],
                 std::shared_ptr<ChMaterialSurface> wheel_mat,
                 std::shared_ptr<ChMaterialSurface> link_mat,
                 ChSystem* system)
    : m_name(name), m_collide_links(false), m_collide_wheel(true) {
    for (int i = 0; i < num_links; i++) {
        bool is_wheel = (data[i].name.compare("link8") == 0);

        std::shared_ptr<RS_Part> link;
        if (is_wheel) {
            link = chrono_types::make_shared<RS_Part>(m_name + "_" + data[i].name, wheel_mat, system);
        } else {
            link = chrono_types::make_shared<RS_Part>(m_name + "_" + data[i].name, link_mat, system);
        }

        double mass = data[i].link.m_mass;
        ChVector<> com = data[i].link.m_com;
        ChVector<> inertia_xx = data[i].link.m_inertia_xx;
        ChVector<> inertia_xy = data[i].link.m_inertia_xy;

        link->m_body->SetIdentifier(4 + 4 * id + i);
        link->m_body->SetMass(mass);
        link->m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
        link->m_body->SetInertiaXX(inertia_xx);
        link->m_body->SetInertiaXY(inertia_xy);

        link->m_mesh_name = data[i].link.m_mesh_name;
        link->m_offset = data[i].link.m_offset;
        link->m_color = data[i].link.m_color;

        for (auto cyl : data[i].link.m_shapes) {
            link->m_cylinders.push_back(cyl);
        }

        if (data[i].include)
            system->Add(link->m_body);

        m_links.insert(std::make_pair(data[i].name, link));
        if (is_wheel)
            m_wheel = link;
    }
}